

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

BinaryOperator slang::ast::Expression::getBinaryOperator(SyntaxKind kind)

{
  logic_error *this;
  string local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  SyntaxKind local_10;
  BinaryOperator local_c;
  SyntaxKind kind_local;
  
  if (kind == AddAssignmentExpression) {
    local_c = Add;
  }
  else if (kind == AddExpression) {
    local_c = Add;
  }
  else if (kind == AndAssignmentExpression) {
    local_c = BinaryAnd;
  }
  else if (kind == ArithmeticLeftShiftAssignmentExpression) {
    local_c = ArithmeticShiftLeft;
  }
  else if (kind == ArithmeticRightShiftAssignmentExpression) {
    local_c = ArithmeticShiftRight;
  }
  else if (kind == ArithmeticShiftLeftExpression) {
    local_c = ArithmeticShiftLeft;
  }
  else if (kind == ArithmeticShiftRightExpression) {
    local_c = ArithmeticShiftRight;
  }
  else if (kind == BinaryAndExpression) {
    local_c = BinaryAnd;
  }
  else if (kind == BinaryOrExpression) {
    local_c = BinaryOr;
  }
  else if (kind == BinaryXnorExpression) {
    local_c = BinaryXnor;
  }
  else if (kind == BinaryXorExpression) {
    local_c = BinaryXor;
  }
  else if (kind == CaseEqualityExpression) {
    local_c = CaseEquality;
  }
  else if (kind == CaseInequalityExpression) {
    local_c = CaseInequality;
  }
  else if (kind == DivideAssignmentExpression) {
    local_c = Divide;
  }
  else if (kind == DivideExpression) {
    local_c = Divide;
  }
  else if (kind == EqualityExpression) {
    local_c = Equality;
  }
  else if (kind == GreaterThanEqualExpression) {
    local_c = GreaterThanEqual;
  }
  else if (kind == GreaterThanExpression) {
    local_c = GreaterThan;
  }
  else if (kind == InequalityExpression) {
    local_c = Inequality;
  }
  else if (kind == LessThanEqualExpression) {
    local_c = LessThanEqual;
  }
  else if (kind == LessThanExpression) {
    local_c = LessThan;
  }
  else if (kind == LogicalAndExpression) {
    local_c = LogicalAnd;
  }
  else if (kind == LogicalEquivalenceExpression) {
    local_c = LogicalEquivalence;
  }
  else if (kind == LogicalImplicationExpression) {
    local_c = LogicalImplication;
  }
  else if (kind == LogicalLeftShiftAssignmentExpression) {
    local_c = LogicalShiftLeft;
  }
  else if (kind == LogicalOrExpression) {
    local_c = LogicalOr;
  }
  else if (kind == LogicalRightShiftAssignmentExpression) {
    local_c = LogicalShiftRight;
  }
  else if (kind == LogicalShiftLeftExpression) {
    local_c = LogicalShiftLeft;
  }
  else if (kind == LogicalShiftRightExpression) {
    local_c = LogicalShiftRight;
  }
  else if (kind == ModAssignmentExpression) {
    local_c = Mod;
  }
  else if (kind == ModExpression) {
    local_c = Mod;
  }
  else if (kind == MultiplyAssignmentExpression) {
    local_c = Multiply;
  }
  else if (kind == MultiplyExpression) {
    local_c = Multiply;
  }
  else if (kind == OrAssignmentExpression) {
    local_c = BinaryOr;
  }
  else if (kind == PowerExpression) {
    local_c = Power;
  }
  else if (kind == SubtractAssignmentExpression) {
    local_c = Subtract;
  }
  else if (kind == SubtractExpression) {
    local_c = Subtract;
  }
  else if (kind == WildcardEqualityExpression) {
    local_c = WildcardEquality;
  }
  else if (kind == WildcardInequalityExpression) {
    local_c = WildcardInequality;
  }
  else {
    if (kind != XorAssignmentExpression) {
      local_10 = kind;
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,&local_b1);
      std::operator+(&local_90,&local_b0,":");
      std::__cxx11::to_string(&local_e8,0x813);
      std::operator+(&local_70,&local_90,&local_e8);
      std::operator+(&local_50,&local_70,": ");
      std::operator+(&local_30,&local_50,"Default case should be unreachable!");
      std::logic_error::logic_error(this,(string *)&local_30);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_c = BinaryXor;
  }
  return local_c;
}

Assistant:

BinaryOperator Expression::getBinaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            ASSUME_UNREACHABLE;
    }
}